

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt_GetGlyphBitmapBoxSubpixel
               (stbtt_fontinfo *font,int glyph,float scale_x,float scale_y,float shift_x,
               float shift_y,int *ix0,int *iy0,int *ix1,int *iy1)

{
  int iVar1;
  float fVar2;
  int local_48;
  int local_44;
  int x0;
  int y0;
  int x1;
  int y1;
  float local_30;
  float local_2c;
  
  local_48 = 0;
  local_44 = 0;
  x1 = (int)shift_y;
  y1 = (int)scale_y;
  local_30 = shift_x;
  local_2c = scale_x;
  iVar1 = stbtt_GetGlyphBox(font,glyph,&local_48,&local_44,&x0,&y0);
  if (iVar1 == 0) {
    if (ix0 != (int *)0x0) {
      *ix0 = 0;
    }
    if (iy0 != (int *)0x0) {
      *iy0 = 0;
    }
    if (ix1 != (int *)0x0) {
      *ix1 = 0;
    }
    iVar1 = 0;
    if (iy1 == (int *)0x0) {
      return;
    }
  }
  else {
    if (ix0 != (int *)0x0) {
      fVar2 = floorf((float)local_48 * local_2c + local_30);
      *ix0 = (int)fVar2;
    }
    if (iy0 != (int *)0x0) {
      fVar2 = floorf((float)-y0 * (float)y1 + (float)x1);
      *iy0 = (int)fVar2;
    }
    if (ix1 != (int *)0x0) {
      fVar2 = ceilf((float)x0 * local_2c + local_30);
      *ix1 = (int)fVar2;
    }
    if (iy1 == (int *)0x0) {
      return;
    }
    fVar2 = ceilf((float)-local_44 * (float)y1 + (float)x1);
    iVar1 = (int)fVar2;
  }
  *iy1 = iVar1;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetGlyphBitmapBoxSubpixel(const stbtt_fontinfo *font, int glyph, float scale_x, float scale_y,float shift_x, float shift_y, int *ix0, int *iy0, int *ix1, int *iy1)
{
   int x0=0,y0=0,x1,y1; // =0 suppresses compiler warning
   if (!stbtt_GetGlyphBox(font, glyph, &x0,&y0,&x1,&y1)) {
      // e.g. space character
      if (ix0) *ix0 = 0;
      if (iy0) *iy0 = 0;
      if (ix1) *ix1 = 0;
      if (iy1) *iy1 = 0;
   } else {
      // move to integral bboxes (treating pixels as little squares, what pixels get touched)?
      if (ix0) *ix0 = STBTT_ifloor( x0 * scale_x + shift_x);
      if (iy0) *iy0 = STBTT_ifloor(-y1 * scale_y + shift_y);
      if (ix1) *ix1 = STBTT_iceil ( x1 * scale_x + shift_x);
      if (iy1) *iy1 = STBTT_iceil (-y0 * scale_y + shift_y);
   }
}